

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_async_logger::push(cubeb_async_logger *this,char *str)

{
  cubeb_log_message msg;
  cubeb_log_message local_110;
  
  cubeb_log_message::cubeb_log_message(&local_110,str);
  ring_buffer_base<cubeb_log_message>::enqueue(&this->msg_queue,&local_110);
  return;
}

Assistant:

void push(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    cubeb_log_message msg(str);
    msg_queue.enqueue(msg);
  }